

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O2

bool deqp::gles2::Functional::compareImages
               (RenderContext *renderCtx,TestLog *log,Surface *ref,Surface *res)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  RGBA threshold;
  RGBA local_24;
  RGBA local_20;
  RGBA local_1c;
  
  iVar2 = (*renderCtx->_vptr_RenderContext[4])();
  local_20 = tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var,iVar2) + 8));
  local_24.m_value = 0xf0f0f0f;
  local_1c = tcu::operator+(&local_20,&local_24);
  bVar1 = tcu::pixelThresholdCompare
                    (log,"Result","Image compare result",ref,res,&local_1c,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

static bool compareImages (const glu::RenderContext& renderCtx, tcu::TestLog& log, const tcu::Surface& ref, const tcu::Surface& res)
{
	DE_ASSERT(renderCtx.getRenderTarget().getNumSamples() == 0);

	const tcu::RGBA threshold = renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(15,15,15,15);
	return tcu::pixelThresholdCompare(log, "Result", "Image compare result", ref, res, threshold, tcu::COMPARE_LOG_RESULT);
}